

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

shared_ptr<ApprovalTests::ApprovalNamer>
ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
getDefaultNamer(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_RDI;
  shared_ptr<ApprovalTests::ApprovalNamer> sVar1;
  _Function_base local_30;
  
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator()(in_RDI);
  ::std::_Function_base::~_Function_base(&local_30);
  sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<ApprovalTests::ApprovalNamer>)
         sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<ApprovalNamer> getDefaultNamer()
        {
            return DefaultNamerFactory::getDefaultNamer()();
        }